

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O1

StringEnumeration * icu_63::MeasureUnit::getAvailableTypes(UErrorCode *errorCode)

{
  UEnumeration *_uenum;
  UStringEnumeration *this;
  size_t size;
  
  size = 0x14;
  _uenum = uenum_openCharStringsEnumeration_63((char **)gTypes,0x14,errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    this = (UStringEnumeration *)UMemory::operator_new((UMemory *)0x80,size);
    if (this == (UStringEnumeration *)0x0) {
      this = (UStringEnumeration *)0x0;
    }
    else {
      UStringEnumeration::UStringEnumeration(this,_uenum);
    }
    if (this != (UStringEnumeration *)0x0) {
      return &this->super_StringEnumeration;
    }
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  uenum_close_63(_uenum);
  return (StringEnumeration *)0x0;
}

Assistant:

StringEnumeration* MeasureUnit::getAvailableTypes(UErrorCode &errorCode) {
    UEnumeration *uenum = uenum_openCharStringsEnumeration(
            gTypes, UPRV_LENGTHOF(gTypes), &errorCode);
    if (U_FAILURE(errorCode)) {
        uenum_close(uenum);
        return NULL;
    }
    StringEnumeration *result = new UStringEnumeration(uenum);
    if (result == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        uenum_close(uenum);
        return NULL;
    }
    return result;
}